

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O2

DynamicObject * __thiscall Js::DynamicObject::Copy(DynamicObject *this,bool deepCopy)

{
  type_info *ptVar1;
  Recycler *pRVar2;
  DynamicObject *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  ptVar1 = (type_info *)
           DynamicTypeHandler::GetInlineSlotsSize
                     (*(DynamicTypeHandler **)((this->super_RecyclableObject).type.ptr + 1));
  pRVar2 = RecyclableObject::GetRecycler(&this->super_RecyclableObject);
  if (ptVar1 == (type_info *)0x0) {
    local_48 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9844c85;
    data.filename._0_4_ = 0x411;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
    this_00 = (DynamicObject *)new<Memory::Recycler>(0x20,pRVar2,0x37a1d4);
  }
  else {
    local_48 = (undefined1  [8])&typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_9844c85;
    data.filename._0_4_ = 0x40d;
    data.typeinfo = ptVar1;
    pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,(TrackAllocData *)local_48);
    this_00 = (DynamicObject *)new<Memory::Recycler>(0x20,pRVar2,0x398e98,0);
  }
  DynamicObject(this_00,this,deepCopy);
  return this_00;
}

Assistant:

DynamicObject *
    DynamicObject::Copy(bool deepCopy)
    {
        size_t inlineSlotsSize = this->GetTypeHandler()->GetInlineSlotsSize();
        if (inlineSlotsSize)
        {
            return RecyclerNewPlusZ(GetRecycler(), inlineSlotsSize, DynamicObject, this, deepCopy);
        }
        else
        {
            return RecyclerNew(GetRecycler(), DynamicObject, this, deepCopy);
        }
    }